

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall btQuantizedBvh::buildTree(btQuantizedBvh *this,int startIndex,int endIndex)

{
  btQuantizedBvhNode *pbVar1;
  btOptimizedBvhNode *pbVar2;
  btScalar *pbVar3;
  btOptimizedBvhNode *pbVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int endIndex_00;
  btOptimizedBvhNode *pbVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  btScalar bVar16;
  btScalar bVar17;
  btScalar bVar18;
  btScalar bVar19;
  btVector3 local_50;
  btVector3 local_40;
  
  iVar11 = this->m_curNodeIndex;
  lVar12 = (long)iVar11;
  if (endIndex - startIndex == 1) {
    if (this->m_useQuantization == true) {
      pbVar10 = (btOptimizedBvhNode *)(this->m_quantizedContiguousNodes).m_data;
      lVar13 = lVar12 << 4;
      pbVar1 = (this->m_quantizedLeafNodes).m_data + startIndex;
      bVar16 = *(btScalar *)pbVar1->m_quantizedAabbMin;
      bVar17 = *(btScalar *)(pbVar1->m_quantizedAabbMin + 2);
      bVar18 = *(btScalar *)(pbVar1->m_quantizedAabbMax + 1);
      bVar19 = (btScalar)pbVar1->m_escapeIndexOrTriangleIndex;
    }
    else {
      pbVar4 = (this->m_leafNodes).m_data;
      pbVar10 = (this->m_contiguousNodes).m_data;
      lVar13 = lVar12 * 0x40;
      pbVar2 = pbVar4 + startIndex;
      bVar16 = (pbVar2->m_aabbMinOrg).m_floats[0];
      bVar17 = (pbVar2->m_aabbMinOrg).m_floats[1];
      bVar18 = (pbVar2->m_aabbMinOrg).m_floats[2];
      bVar19 = (pbVar2->m_aabbMinOrg).m_floats[3];
      uVar5 = *(undefined8 *)pbVar4[startIndex].m_aabbMaxOrg.m_floats;
      uVar6 = *(undefined8 *)(pbVar4[startIndex].m_aabbMaxOrg.m_floats + 2);
      pbVar2 = pbVar4 + startIndex;
      iVar11 = pbVar2->m_escapeIndex;
      iVar9 = pbVar2->m_subPart;
      uVar7 = *(undefined8 *)(&pbVar2->m_escapeIndex + 2);
      uVar8 = *(undefined8 *)(pbVar4[startIndex].m_padding + 4 + 8);
      *(undefined8 *)(pbVar10[lVar12].m_padding + 4) =
           *(undefined8 *)(pbVar4[startIndex].m_padding + 4);
      *(undefined8 *)(pbVar10[lVar12].m_padding + 0xc) = uVar8;
      pbVar2 = pbVar10 + lVar12;
      pbVar2->m_escapeIndex = iVar11;
      pbVar2->m_subPart = iVar9;
      *(undefined8 *)(&pbVar2->m_escapeIndex + 2) = uVar7;
      *(undefined8 *)pbVar10[lVar12].m_aabbMaxOrg.m_floats = uVar5;
      *(undefined8 *)(pbVar10[lVar12].m_aabbMaxOrg.m_floats + 2) = uVar6;
    }
    pbVar3 = (btScalar *)((long)(pbVar10->m_aabbMinOrg).m_floats + lVar13);
    *pbVar3 = bVar16;
    pbVar3[1] = bVar17;
    pbVar3[2] = bVar18;
    pbVar3[3] = bVar19;
    this->m_curNodeIndex = this->m_curNodeIndex + 1;
  }
  else {
    iVar9 = calcSplittingAxis(this,startIndex,endIndex);
    endIndex_00 = sortAndCalcSplittingIndex(this,startIndex,endIndex,iVar9);
    iVar9 = this->m_curNodeIndex;
    setInternalNodeAabbMin(this,iVar9,&this->m_bvhAabbMax);
    setInternalNodeAabbMax(this,this->m_curNodeIndex,&this->m_bvhAabbMin);
    if (startIndex < endIndex) {
      iVar15 = startIndex;
      do {
        iVar14 = this->m_curNodeIndex;
        local_40 = getAabbMin(this,iVar15);
        local_50 = getAabbMax(this,iVar15);
        mergeInternalNodeAabb(this,iVar14,&local_40,&local_50);
        iVar15 = iVar15 + 1;
      } while (endIndex != iVar15);
    }
    iVar14 = this->m_curNodeIndex + 1;
    this->m_curNodeIndex = iVar14;
    buildTree(this,startIndex,endIndex_00);
    iVar15 = this->m_curNodeIndex;
    buildTree(this,endIndex_00,endIndex);
    iVar11 = this->m_curNodeIndex - iVar11;
    if ((this->m_useQuantization == true) && (0x80 < iVar11)) {
      updateSubtreeHeaders(this,iVar14,iVar15);
    }
    if (this->m_useQuantization == true) {
      (this->m_quantizedContiguousNodes).m_data[iVar9].m_escapeIndexOrTriangleIndex = -iVar11;
    }
    else {
      (this->m_contiguousNodes).m_data[iVar9].m_escapeIndex = iVar11;
    }
  }
  return;
}

Assistant:

void	btQuantizedBvh::buildTree	(int startIndex,int endIndex)
{
#ifdef DEBUG_TREE_BUILDING
	gStackDepth++;
	if (gStackDepth > gMaxStackDepth)
		gMaxStackDepth = gStackDepth;
#endif //DEBUG_TREE_BUILDING


	int splitAxis, splitIndex, i;
	int numIndices =endIndex-startIndex;
	int curIndex = m_curNodeIndex;

	btAssert(numIndices>0);

	if (numIndices==1)
	{
#ifdef DEBUG_TREE_BUILDING
		gStackDepth--;
#endif //DEBUG_TREE_BUILDING
		
		assignInternalNodeFromLeafNode(m_curNodeIndex,startIndex);

		m_curNodeIndex++;
		return;	
	}
	//calculate Best Splitting Axis and where to split it. Sort the incoming 'leafNodes' array within range 'startIndex/endIndex'.
	
	splitAxis = calcSplittingAxis(startIndex,endIndex);

	splitIndex = sortAndCalcSplittingIndex(startIndex,endIndex,splitAxis);

	int internalNodeIndex = m_curNodeIndex;
	
	//set the min aabb to 'inf' or a max value, and set the max aabb to a -inf/minimum value.
	//the aabb will be expanded during buildTree/mergeInternalNodeAabb with actual node values
	setInternalNodeAabbMin(m_curNodeIndex,m_bvhAabbMax);//can't use btVector3(SIMD_INFINITY,SIMD_INFINITY,SIMD_INFINITY)) because of quantization
	setInternalNodeAabbMax(m_curNodeIndex,m_bvhAabbMin);//can't use btVector3(-SIMD_INFINITY,-SIMD_INFINITY,-SIMD_INFINITY)) because of quantization
	
	
	for (i=startIndex;i<endIndex;i++)
	{
		mergeInternalNodeAabb(m_curNodeIndex,getAabbMin(i),getAabbMax(i));
	}

	m_curNodeIndex++;
	

	//internalNode->m_escapeIndex;
	
	int leftChildNodexIndex = m_curNodeIndex;

	//build left child tree
	buildTree(startIndex,splitIndex);

	int rightChildNodexIndex = m_curNodeIndex;
	//build right child tree
	buildTree(splitIndex,endIndex);

#ifdef DEBUG_TREE_BUILDING
	gStackDepth--;
#endif //DEBUG_TREE_BUILDING

	int escapeIndex = m_curNodeIndex - curIndex;

	if (m_useQuantization)
	{
		//escapeIndex is the number of nodes of this subtree
		const int sizeQuantizedNode =sizeof(btQuantizedBvhNode);
		const int treeSizeInBytes = escapeIndex * sizeQuantizedNode;
		if (treeSizeInBytes > MAX_SUBTREE_SIZE_IN_BYTES)
		{
			updateSubtreeHeaders(leftChildNodexIndex,rightChildNodexIndex);
		}
	} else
	{

	}

	setInternalNodeEscapeIndex(internalNodeIndex,escapeIndex);

}